

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emoticon.cpp
# Opt level: O0

void __thiscall CEmoticon::DrawCircle(CEmoticon *this,float x,float y,float r,int Segments)

{
  IGraphics *pIVar1;
  uint uVar2;
  long lVar3;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float Sa3;
  float Sa2;
  float Sa1;
  float Ca3;
  float Ca2;
  float Ca1;
  float a3;
  float a2;
  float a1;
  int i;
  float FSegments;
  int NumItems;
  CFreeformItem Array [32];
  CFreeformItem *local_478;
  int local_44c;
  uint local_444;
  CFreeformItem local_428;
  CFreeformItem local_408 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_478 = local_408;
  do {
    IGraphics::CFreeformItem::CFreeformItem(local_478);
    local_478 = local_478 + 1;
  } while (local_478 != (CFreeformItem *)&stack0xfffffffffffffff8);
  local_444 = 0;
  fVar4 = (float)in_ESI;
  for (local_44c = 0; local_44c < in_ESI; local_44c = local_44c + 2) {
    fVar5 = ((float)local_44c / fVar4) * 2.0 * 3.1415927;
    fVar6 = ((float)(local_44c + 1) / fVar4) * 2.0 * 3.1415927;
    fVar7 = ((float)(local_44c + 2) / fVar4) * 2.0 * 3.1415927;
    fVar8 = cosf(fVar5);
    fVar9 = cosf(fVar6);
    fVar10 = cosf(fVar7);
    fVar5 = sinf(fVar5);
    fVar6 = sinf(fVar6);
    fVar7 = sinf(fVar7);
    IGraphics::CFreeformItem::CFreeformItem
              (&local_428,in_XMM0_Da,in_XMM1_Da,fVar8 * in_XMM2_Da + in_XMM0_Da,
               fVar5 * in_XMM2_Da + in_XMM1_Da,fVar10 * in_XMM2_Da + in_XMM0_Da,
               fVar7 * in_XMM2_Da + in_XMM1_Da,fVar9 * in_XMM2_Da + in_XMM0_Da,
               fVar6 * in_XMM2_Da + in_XMM1_Da);
    uVar2 = local_444 + 1;
    lVar3 = (long)(int)local_444;
    local_408[lVar3].m_X0 = local_428.m_X0;
    local_408[lVar3].m_Y0 = local_428.m_Y0;
    local_408[lVar3].m_X1 = local_428.m_X1;
    local_408[lVar3].m_Y1 = local_428.m_Y1;
    local_408[lVar3].m_X2 = local_428.m_X2;
    local_408[lVar3].m_Y2 = local_428.m_Y2;
    local_408[lVar3].m_X3 = local_428.m_X3;
    local_408[lVar3].m_Y3 = local_428.m_Y3;
    local_444 = uVar2;
    if (uVar2 == 0x20) {
      pIVar1 = CGameClient::Graphics(*(CGameClient **)(in_RDI + 8));
      (*(pIVar1->super_IInterface)._vptr_IInterface[0x1e])(pIVar1,local_408,0x20);
      local_444 = 0;
    }
  }
  if (local_444 != 0) {
    pIVar1 = CGameClient::Graphics(*(CGameClient **)(in_RDI + 8));
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x1e])(pIVar1,local_408,(ulong)local_444);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEmoticon::DrawCircle(float x, float y, float r, int Segments)
{
	IGraphics::CFreeformItem Array[32];
	int NumItems = 0;
	float FSegments = (float)Segments;
	for(int i = 0; i < Segments; i+=2)
	{
		float a1 = i/FSegments * 2*pi;
		float a2 = (i+1)/FSegments * 2*pi;
		float a3 = (i+2)/FSegments * 2*pi;
		float Ca1 = cosf(a1);
		float Ca2 = cosf(a2);
		float Ca3 = cosf(a3);
		float Sa1 = sinf(a1);
		float Sa2 = sinf(a2);
		float Sa3 = sinf(a3);

		Array[NumItems++] = IGraphics::CFreeformItem(
			x, y,
			x+Ca1*r, y+Sa1*r,
			x+Ca3*r, y+Sa3*r,
			x+Ca2*r, y+Sa2*r);
		if(NumItems == 32)
		{
			m_pClient->Graphics()->QuadsDrawFreeform(Array, 32);
			NumItems = 0;
		}
	}
	if(NumItems)
		m_pClient->Graphics()->QuadsDrawFreeform(Array, NumItems);
}